

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

void barrett_reduction(uint64_t *z,uint64_t *t)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined1 x_06 [16];
  undefined1 x_07 [16];
  undefined1 x_08 [16];
  undefined1 x_09 [16];
  undefined1 x_10 [16];
  undefined1 x_11 [16];
  undefined1 x_12 [16];
  undefined1 x_13 [16];
  undefined1 x_14 [16];
  undefined1 x_15 [16];
  undefined1 x_16 [16];
  undefined1 x_17 [16];
  undefined1 x_18 [16];
  undefined1 x_19 [16];
  undefined1 x_20 [16];
  undefined1 x_21 [16];
  undefined1 x_22 [16];
  undefined1 x_23 [16];
  undefined1 x_24 [16];
  undefined1 x_25 [16];
  undefined1 x_26 [16];
  undefined1 x_27 [16];
  undefined1 x_28 [16];
  undefined1 x_29 [16];
  undefined1 x_30 [16];
  undefined1 x_31 [16];
  undefined1 x_32 [16];
  undefined1 x_33 [16];
  undefined1 x_34 [16];
  undefined1 x_35 [16];
  undefined1 x_36 [16];
  undefined1 x_37 [16];
  undefined1 x_38 [16];
  undefined1 x_39 [16];
  undefined1 x_40 [16];
  undefined1 x_41 [16];
  undefined1 x_42 [16];
  undefined1 x_43 [16];
  undefined1 x_44 [16];
  undefined1 x_45 [16];
  undefined1 x_46 [16];
  undefined1 x_47 [16];
  undefined1 x_48 [16];
  undefined1 x_49 [16];
  undefined1 x_50 [16];
  undefined1 x_51 [16];
  undefined1 x_52 [16];
  undefined1 x_53 [16];
  undefined1 x_54 [16];
  undefined1 x_55 [16];
  undefined1 x_56 [16];
  undefined1 x_57 [16];
  undefined1 x_58 [16];
  undefined1 x_59 [16];
  undefined1 x_60 [16];
  undefined1 x_61 [16];
  undefined1 x_62 [16];
  undefined1 x_63 [16];
  undefined1 x_64 [16];
  undefined1 x_65 [16];
  undefined1 x_66 [16];
  undefined1 x_67 [16];
  undefined1 x_68 [16];
  undefined1 x_69 [16];
  undefined1 x_70 [16];
  undefined1 x_71 [16];
  undefined1 x_72 [16];
  undefined1 x_73 [16];
  undefined1 x_74 [16];
  undefined1 y [16];
  undefined1 y_00 [16];
  undefined1 y_01 [16];
  undefined1 y_02 [16];
  undefined1 y_03 [16];
  undefined1 y_04 [16];
  undefined1 y_05 [16];
  undefined1 y_06 [16];
  undefined1 y_07 [16];
  undefined1 y_08 [16];
  undefined1 y_09 [16];
  undefined1 y_10 [16];
  undefined1 y_11 [16];
  undefined1 y_12 [16];
  undefined1 y_13 [16];
  undefined1 y_14 [16];
  undefined1 y_15 [16];
  undefined1 y_16 [16];
  undefined1 y_17 [16];
  undefined1 y_18 [16];
  undefined1 y_19 [16];
  undefined1 y_20 [16];
  undefined1 y_21 [16];
  undefined1 y_22 [16];
  undefined1 y_23 [16];
  undefined1 y_24 [16];
  undefined1 y_25 [16];
  undefined1 y_26 [16];
  undefined1 y_27 [16];
  undefined1 y_28 [16];
  undefined1 y_29 [16];
  undefined1 y_30 [16];
  undefined1 y_31 [16];
  undefined1 y_32 [16];
  undefined1 y_33 [16];
  undefined1 y_34 [16];
  undefined1 y_35 [16];
  undefined1 y_36 [16];
  undefined1 y_37 [16];
  undefined1 y_38 [16];
  undefined1 y_39 [16];
  undefined1 y_40 [16];
  undefined1 y_41 [16];
  undefined1 y_42 [16];
  undefined1 y_43 [16];
  undefined1 y_44 [16];
  undefined1 y_45 [16];
  undefined1 y_46 [16];
  undefined1 y_47 [16];
  undefined1 y_48 [16];
  undefined1 y_49 [16];
  undefined1 y_50 [16];
  FStar_UInt128_uint128 *pFVar5;
  FStar_UInt128_uint128 *pFVar6;
  FStar_UInt128_uint128 *pFVar7;
  FStar_UInt128_uint128 *pFVar8;
  FStar_UInt128_uint128 *pFVar9;
  FStar_UInt128_uint128 *pFVar10;
  FStar_UInt128_uint128 *pFVar11;
  FStar_UInt128_uint128 *pFVar12;
  FStar_UInt128_uint128 *pFVar13;
  uint64_t uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint32_t y_51;
  uint32_t y_52;
  uint32_t y_53;
  uint32_t y_54;
  uint32_t y_55;
  uint32_t y_56;
  uint32_t y_57;
  uint32_t y_58;
  uint32_t y_59;
  uint32_t y_60;
  uint32_t y_61;
  uint64_t in_RDX;
  uint64_t y_62;
  uint64_t y_63;
  uint64_t y_64;
  uint64_t y_65;
  uint64_t y_66;
  uint64_t y_67;
  uint64_t y_68;
  uint64_t y_69;
  uint64_t y_70;
  uint64_t y_71;
  uint64_t y_72;
  uint64_t y_73;
  uint64_t y_74;
  uint64_t y_75;
  uint64_t y_76;
  uint64_t y_77;
  uint64_t y_78;
  uint64_t y_79;
  uint64_t y_80;
  uint64_t y_81;
  uint64_t y_82;
  uint64_t y_83;
  uint64_t y_84;
  uint64_t y_85;
  uint64_t y_86;
  uint64_t y_87;
  uint64_t y_88;
  uint64_t y_89;
  uint64_t y_90;
  uint64_t y_91;
  uint64_t y_92;
  uint64_t y_93;
  uint64_t y_94;
  uint64_t y_95;
  uint64_t y_96;
  uint64_t y_97;
  uint64_t y_98;
  uint64_t y_99;
  undefined4 in_stack_ffffffffffffe668;
  undefined4 in_stack_ffffffffffffe66c;
  undefined4 uVar26;
  ulong uVar27;
  undefined8 local_1988;
  uint64_t z4;
  uint64_t z3;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t o4;
  uint64_t o3;
  uint64_t o2;
  uint64_t o1;
  uint64_t o0;
  uint64_t z44;
  uint64_t z34;
  uint64_t z24;
  uint64_t z14;
  uint64_t z04;
  uint64_t z43;
  uint64_t z33;
  uint64_t z23;
  uint64_t z13;
  uint64_t z03;
  uint64_t mask;
  uint64_t t41;
  uint64_t b4;
  uint64_t t10;
  uint64_t b;
  uint64_t t31;
  uint64_t b3;
  uint64_t t1017;
  uint64_t b13;
  uint64_t t21;
  uint64_t b2;
  uint64_t t1016;
  uint64_t b12;
  uint64_t t11;
  uint64_t b1;
  uint64_t t1015;
  uint64_t b11;
  uint64_t t01;
  uint64_t b0;
  uint64_t t1014;
  uint64_t b10;
  uint64_t y4;
  uint64_t y3;
  uint64_t y2;
  uint64_t y1;
  uint64_t y0;
  uint64_t m41;
  uint64_t m31;
  uint64_t m21;
  uint64_t m11;
  uint64_t m01;
  uint64_t s4;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uint64_t t412;
  uint64_t t1013;
  uint64_t b9;
  uint64_t t311;
  uint64_t c4;
  uint64_t t1012;
  uint64_t b8;
  uint64_t t211;
  uint64_t c3;
  uint64_t t1011;
  uint64_t b7;
  uint64_t t111;
  uint64_t c2;
  uint64_t t1010;
  uint64_t b6;
  uint64_t t011;
  uint64_t c1;
  uint64_t t109;
  uint64_t b5;
  uint64_t qmul4;
  uint64_t qmul3;
  uint64_t qmul2;
  uint64_t qmul1;
  uint64_t qmul0;
  uint64_t t411;
  uint64_t t310;
  FStar_UInt128_uint128 c31;
  uint64_t t108;
  FStar_UInt128_uint128 carry;
  uint64_t t210;
  FStar_UInt128_uint128 c21;
  uint64_t t107;
  FStar_UInt128_uint128 carry11;
  uint64_t t110;
  FStar_UInt128_uint128 c11;
  uint64_t t106;
  FStar_UInt128_uint128 carry10;
  uint64_t t010;
  FStar_UInt128_uint128 c0;
  uint64_t t105;
  FStar_UInt128_uint128 carry9;
  FStar_UInt128_uint128 xy40;
  FStar_UInt128_uint128 xy31;
  FStar_UInt128_uint128 xy30;
  FStar_UInt128_uint128 xy22;
  FStar_UInt128_uint128 xy21;
  FStar_UInt128_uint128 xy20;
  FStar_UInt128_uint128 xy13;
  FStar_UInt128_uint128 xy12;
  FStar_UInt128_uint128 xy11;
  FStar_UInt128_uint128 xy10;
  FStar_UInt128_uint128 xy04;
  FStar_UInt128_uint128 xy03;
  FStar_UInt128_uint128 xy02;
  FStar_UInt128_uint128 xy01;
  FStar_UInt128_uint128 xy00;
  uint64_t r4;
  uint64_t r3;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint64_t qdiv4;
  uint64_t qdiv3;
  uint64_t qdiv2;
  uint64_t qdiv1;
  uint64_t qdiv0;
  uint64_t z42;
  uint64_t x_8;
  uint64_t y_8;
  uint64_t z32;
  uint64_t x_7;
  uint64_t y_7;
  uint64_t z22;
  uint64_t x_6;
  uint64_t y_6;
  uint64_t z12;
  uint64_t x_5;
  uint64_t y_5;
  uint64_t z02;
  uint64_t x_4;
  uint64_t y_4;
  uint64_t qmu9_;
  uint64_t qmu8_;
  uint64_t qmu7_;
  uint64_t qmu6_;
  uint64_t qmu5_;
  uint64_t qmu4_;
  uint64_t t91;
  uint64_t t81;
  FStar_UInt128_uint128 c8;
  uint64_t t104;
  FStar_UInt128_uint128 carry8;
  uint64_t t71;
  FStar_UInt128_uint128 c7;
  uint64_t t103;
  FStar_UInt128_uint128 carry7;
  uint64_t t61;
  FStar_UInt128_uint128 c6;
  uint64_t t102;
  FStar_UInt128_uint128 carry6;
  uint64_t t51;
  FStar_UInt128_uint128 c5;
  uint64_t t101;
  FStar_UInt128_uint128 carry5;
  uint64_t t410;
  FStar_UInt128_uint128 c40;
  uint64_t t100;
  FStar_UInt128_uint128 carry4;
  FStar_UInt128_uint128 c30;
  FStar_UInt128_uint128 carry3;
  FStar_UInt128_uint128 c20;
  FStar_UInt128_uint128 carry2;
  FStar_UInt128_uint128 c10;
  FStar_UInt128_uint128 carry1;
  FStar_UInt128_uint128 c00;
  FStar_UInt128_uint128 carry0;
  FStar_UInt128_uint128 z8;
  FStar_UInt128_uint128 z7;
  FStar_UInt128_uint128 z6;
  FStar_UInt128_uint128 z5;
  FStar_UInt128_uint128 z41;
  FStar_UInt128_uint128 z31;
  FStar_UInt128_uint128 z21;
  FStar_UInt128_uint128 z11;
  FStar_UInt128_uint128 z01;
  FStar_UInt128_uint128 xy44;
  FStar_UInt128_uint128 xy43;
  FStar_UInt128_uint128 xy42;
  FStar_UInt128_uint128 xy41;
  FStar_UInt128_uint128 xy400;
  FStar_UInt128_uint128 xy34;
  FStar_UInt128_uint128 xy33;
  FStar_UInt128_uint128 xy32;
  FStar_UInt128_uint128 xy310;
  FStar_UInt128_uint128 xy300;
  FStar_UInt128_uint128 xy24;
  FStar_UInt128_uint128 xy23;
  FStar_UInt128_uint128 xy220;
  FStar_UInt128_uint128 xy210;
  FStar_UInt128_uint128 xy200;
  FStar_UInt128_uint128 xy14;
  FStar_UInt128_uint128 xy130;
  FStar_UInt128_uint128 xy120;
  FStar_UInt128_uint128 xy110;
  FStar_UInt128_uint128 xy100;
  FStar_UInt128_uint128 xy040;
  FStar_UInt128_uint128 xy030;
  FStar_UInt128_uint128 xy020;
  FStar_UInt128_uint128 xy010;
  FStar_UInt128_uint128 xy000;
  uint64_t q4;
  uint64_t q3;
  uint64_t q2;
  uint64_t q1;
  uint64_t q0;
  uint64_t z40;
  uint64_t x_3;
  uint64_t y_3;
  uint64_t z30;
  uint64_t x_2;
  uint64_t y_2;
  uint64_t z20;
  uint64_t x_1;
  uint64_t y_1;
  uint64_t z10;
  uint64_t x_0;
  uint64_t y_0;
  uint64_t z00;
  uint64_t x_;
  uint64_t y_;
  uint64_t mu4;
  uint64_t mu3;
  uint64_t mu2;
  uint64_t mu1;
  uint64_t mu0;
  uint64_t m410;
  uint64_t m310;
  uint64_t m210;
  uint64_t m110;
  uint64_t m010;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint64_t m40;
  uint64_t m30;
  uint64_t m20;
  uint64_t m10;
  uint64_t m00;
  uint64_t t9;
  uint64_t t8;
  uint64_t t7;
  uint64_t t6;
  uint64_t t5;
  uint64_t t4;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  uint64_t *t_local;
  uint64_t *z_local;
  
  uVar1 = *t;
  uVar2 = t[1];
  uVar3 = t[2];
  uVar4 = t[3];
  uVar20 = t[4];
  uVar27 = 0xffffffffffffff;
  t6._0_4_ = (uint)t[5];
  pFVar5 = (FStar_UInt128_uint128 *)(uVar20 >> 0x18 | (ulong)((uint)t6 & 0xffffff) << 0x20);
  t7._0_4_ = (uint)t[6];
  pFVar6 = (FStar_UInt128_uint128 *)(t[5] >> 0x18 | (ulong)((uint)t7 & 0xffffff) << 0x20);
  t8._0_4_ = (uint)t[7];
  pFVar7 = (FStar_UInt128_uint128 *)(t[6] >> 0x18 | (ulong)((uint)t8 & 0xffffff) << 0x20);
  t9._0_4_ = (uint)t[8];
  pFVar8 = (FStar_UInt128_uint128 *)(t[7] >> 0x18 | (ulong)((uint)t9 & 0xffffff) << 0x20);
  m00._0_4_ = (uint)t[9];
  pFVar9 = (FStar_UInt128_uint128 *)(t[8] >> 0x18 | (ulong)((uint)m00 & 0xffffff) << 0x20);
  pFVar10 = FStar_UInt128_mul_wide(pFVar5,0x9ce5a30a2c131b,in_RDX);
  pFVar11 = FStar_UInt128_mul_wide(pFVar5,0x215d086329a7ed,y_62);
  pFVar12 = FStar_UInt128_mul_wide(pFVar5,0xffffffffeb2106,y_63);
  pFVar13 = FStar_UInt128_mul_wide(pFVar5,0xffffffffffffff,y_64);
  pFVar5 = FStar_UInt128_mul_wide(pFVar5,0xfffffffff,y_65);
  FStar_UInt128_mul_wide(pFVar6,0x9ce5a30a2c131b,y_66);
  FStar_UInt128_mul_wide(pFVar6,0x215d086329a7ed,y_67);
  FStar_UInt128_mul_wide(pFVar6,0xffffffffeb2106,y_68);
  FStar_UInt128_mul_wide(pFVar6,0xffffffffffffff,y_69);
  pFVar6 = FStar_UInt128_mul_wide(pFVar6,0xfffffffff,y_70);
  FStar_UInt128_mul_wide(pFVar7,0x9ce5a30a2c131b,y_71);
  FStar_UInt128_mul_wide(pFVar7,0x215d086329a7ed,y_72);
  FStar_UInt128_mul_wide(pFVar7,0xffffffffeb2106,y_73);
  FStar_UInt128_mul_wide(pFVar7,0xffffffffffffff,y_74);
  pFVar7 = FStar_UInt128_mul_wide(pFVar7,0xfffffffff,y_75);
  FStar_UInt128_mul_wide(pFVar8,0x9ce5a30a2c131b,y_76);
  FStar_UInt128_mul_wide(pFVar8,0x215d086329a7ed,y_77);
  FStar_UInt128_mul_wide(pFVar8,0xffffffffeb2106,y_78);
  FStar_UInt128_mul_wide(pFVar8,0xffffffffffffff,y_79);
  pFVar8 = FStar_UInt128_mul_wide(pFVar8,0xfffffffff,y_80);
  FStar_UInt128_mul_wide(pFVar9,0x9ce5a30a2c131b,y_81);
  FStar_UInt128_mul_wide(pFVar9,0x215d086329a7ed,y_82);
  FStar_UInt128_mul_wide(pFVar9,0xffffffffeb2106,y_83);
  FStar_UInt128_mul_wide(pFVar9,0xffffffffffffff,y_84);
  pFVar9 = FStar_UInt128_mul_wide(pFVar9,0xfffffffff,y_85);
  x._4_4_ = in_stack_ffffffffffffe66c;
  x._0_4_ = in_stack_ffffffffffffe668;
  x._8_8_ = uVar27;
  y._8_8_ = z4;
  y._0_8_ = local_1988;
  pFVar11 = FStar_UInt128_add_mod(pFVar11,(uint128_t)x,(uint128_t)y);
  x_00._4_4_ = in_stack_ffffffffffffe66c;
  x_00._0_4_ = in_stack_ffffffffffffe668;
  x_00._8_8_ = uVar27;
  y_00._8_8_ = z4;
  y_00._0_8_ = local_1988;
  pFVar12 = FStar_UInt128_add_mod(pFVar12,(uint128_t)x_00,(uint128_t)y_00);
  x_01._4_4_ = in_stack_ffffffffffffe66c;
  x_01._0_4_ = in_stack_ffffffffffffe668;
  x_01._8_8_ = uVar27;
  y_01._8_8_ = z4;
  y_01._0_8_ = local_1988;
  pFVar12 = FStar_UInt128_add_mod(pFVar12,(uint128_t)x_01,(uint128_t)y_01);
  x_02._4_4_ = in_stack_ffffffffffffe66c;
  x_02._0_4_ = in_stack_ffffffffffffe668;
  x_02._8_8_ = uVar27;
  y_02._8_8_ = z4;
  y_02._0_8_ = local_1988;
  pFVar13 = FStar_UInt128_add_mod(pFVar13,(uint128_t)x_02,(uint128_t)y_02);
  x_03._4_4_ = in_stack_ffffffffffffe66c;
  x_03._0_4_ = in_stack_ffffffffffffe668;
  x_03._8_8_ = uVar27;
  y_03._8_8_ = z4;
  y_03._0_8_ = local_1988;
  pFVar13 = FStar_UInt128_add_mod(pFVar13,(uint128_t)x_03,(uint128_t)y_03);
  x_04._4_4_ = in_stack_ffffffffffffe66c;
  x_04._0_4_ = in_stack_ffffffffffffe668;
  x_04._8_8_ = uVar27;
  y_04._8_8_ = z4;
  y_04._0_8_ = local_1988;
  pFVar13 = FStar_UInt128_add_mod(pFVar13,(uint128_t)x_04,(uint128_t)y_04);
  x_05._4_4_ = in_stack_ffffffffffffe66c;
  x_05._0_4_ = in_stack_ffffffffffffe668;
  x_05._8_8_ = uVar27;
  y_05._8_8_ = z4;
  y_05._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_05,(uint128_t)y_05);
  x_06._4_4_ = in_stack_ffffffffffffe66c;
  x_06._0_4_ = in_stack_ffffffffffffe668;
  x_06._8_8_ = uVar27;
  y_06._8_8_ = z4;
  y_06._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_06,(uint128_t)y_06);
  x_07._4_4_ = in_stack_ffffffffffffe66c;
  x_07._0_4_ = in_stack_ffffffffffffe668;
  x_07._8_8_ = uVar27;
  y_07._8_8_ = z4;
  y_07._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_07,(uint128_t)y_07);
  x_08._4_4_ = in_stack_ffffffffffffe66c;
  x_08._0_4_ = in_stack_ffffffffffffe668;
  x_08._8_8_ = uVar27;
  y_08._8_8_ = z4;
  y_08._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_08,(uint128_t)y_08);
  x_09._4_4_ = in_stack_ffffffffffffe66c;
  x_09._0_4_ = in_stack_ffffffffffffe668;
  x_09._8_8_ = uVar27;
  y_09._8_8_ = z4;
  y_09._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_09,(uint128_t)y_09);
  x_10._4_4_ = in_stack_ffffffffffffe66c;
  x_10._0_4_ = in_stack_ffffffffffffe668;
  x_10._8_8_ = uVar27;
  y_10._8_8_ = z4;
  y_10._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_10,(uint128_t)y_10);
  x_11._4_4_ = in_stack_ffffffffffffe66c;
  x_11._0_4_ = in_stack_ffffffffffffe668;
  x_11._8_8_ = uVar27;
  y_11._8_8_ = z4;
  y_11._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_11,(uint128_t)y_11);
  x_12._4_4_ = in_stack_ffffffffffffe66c;
  x_12._0_4_ = in_stack_ffffffffffffe668;
  x_12._8_8_ = uVar27;
  y_12._8_8_ = z4;
  y_12._0_8_ = local_1988;
  pFVar7 = FStar_UInt128_add_mod(pFVar7,(uint128_t)x_12,(uint128_t)y_12);
  x_13._4_4_ = in_stack_ffffffffffffe66c;
  x_13._0_4_ = in_stack_ffffffffffffe668;
  x_13._8_8_ = uVar27;
  y_13._8_8_ = z4;
  y_13._0_8_ = local_1988;
  pFVar7 = FStar_UInt128_add_mod(pFVar7,(uint128_t)x_13,(uint128_t)y_13);
  x_14._4_4_ = in_stack_ffffffffffffe66c;
  x_14._0_4_ = in_stack_ffffffffffffe668;
  x_14._8_8_ = uVar27;
  y_14._8_8_ = z4;
  y_14._0_8_ = local_1988;
  pFVar8 = FStar_UInt128_add_mod(pFVar8,(uint128_t)x_14,(uint128_t)y_14);
  uVar26 = 0x38;
  x_15._4_4_ = 0x38;
  x_15._0_4_ = in_stack_ffffffffffffe668;
  x_15._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar10,(uint128_t)x_15,(uint32_t)y_62);
  x_16._4_4_ = uVar26;
  x_16._0_4_ = in_stack_ffffffffffffe668;
  x_16._8_8_ = uVar27;
  y_15._8_8_ = z4;
  y_15._0_8_ = local_1988;
  pFVar10 = FStar_UInt128_add_mod(pFVar11,(uint128_t)x_16,(uint128_t)y_15);
  x_17._4_4_ = uVar26;
  x_17._0_4_ = in_stack_ffffffffffffe668;
  x_17._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar10,(uint128_t)x_17,y_51);
  x_18._4_4_ = uVar26;
  x_18._0_4_ = in_stack_ffffffffffffe668;
  x_18._8_8_ = uVar27;
  y_16._8_8_ = z4;
  y_16._0_8_ = local_1988;
  pFVar10 = FStar_UInt128_add_mod(pFVar12,(uint128_t)x_18,(uint128_t)y_16);
  x_19._4_4_ = uVar26;
  x_19._0_4_ = in_stack_ffffffffffffe668;
  x_19._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar10,(uint128_t)x_19,y_52);
  x_20._4_4_ = uVar26;
  x_20._0_4_ = in_stack_ffffffffffffe668;
  x_20._8_8_ = uVar27;
  y_17._8_8_ = z4;
  y_17._0_8_ = local_1988;
  pFVar10 = FStar_UInt128_add_mod(pFVar13,(uint128_t)x_20,(uint128_t)y_17);
  x_21._4_4_ = uVar26;
  x_21._0_4_ = in_stack_ffffffffffffe668;
  x_21._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar10,(uint128_t)x_21,y_53);
  x_22._4_4_ = uVar26;
  x_22._0_4_ = in_stack_ffffffffffffe668;
  x_22._8_8_ = uVar27;
  y_18._8_8_ = z4;
  y_18._0_8_ = local_1988;
  pFVar10 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_22,(uint128_t)y_18);
  x_23._4_4_ = uVar26;
  x_23._0_4_ = in_stack_ffffffffffffe668;
  x_23._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar10,(uint128_t)x_23,y_54);
  x_24._4_4_ = uVar26;
  x_24._0_4_ = in_stack_ffffffffffffe668;
  x_24._8_8_ = uVar27;
  y_19._8_8_ = z4;
  y_19._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar5,(uint128_t)x_24,(uint128_t)y_19);
  x_25._4_4_ = uVar26;
  x_25._0_4_ = in_stack_ffffffffffffe668;
  x_25._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_25);
  uVar15 = uVar14 & uVar27;
  x_26._4_4_ = uVar26;
  x_26._0_4_ = in_stack_ffffffffffffe668;
  x_26._8_8_ = uVar27;
  y_20._8_8_ = z4;
  y_20._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_26,(uint128_t)y_20);
  x_27._4_4_ = uVar26;
  x_27._0_4_ = in_stack_ffffffffffffe668;
  x_27._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar5,(uint128_t)x_27,y_55);
  x_28._4_4_ = uVar26;
  x_28._0_4_ = in_stack_ffffffffffffe668;
  x_28._8_8_ = uVar27;
  y_21._8_8_ = z4;
  y_21._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar6,(uint128_t)x_28,(uint128_t)y_21);
  x_29._4_4_ = uVar26;
  x_29._0_4_ = in_stack_ffffffffffffe668;
  x_29._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_29);
  uVar16 = uVar14 & uVar27;
  x_30._4_4_ = uVar26;
  x_30._0_4_ = in_stack_ffffffffffffe668;
  x_30._8_8_ = uVar27;
  y_22._8_8_ = z4;
  y_22._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar7,(uint128_t)x_30,(uint128_t)y_22);
  x_31._4_4_ = uVar26;
  x_31._0_4_ = in_stack_ffffffffffffe668;
  x_31._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar5,(uint128_t)x_31,y_56);
  x_32._4_4_ = uVar26;
  x_32._0_4_ = in_stack_ffffffffffffe668;
  x_32._8_8_ = uVar27;
  y_23._8_8_ = z4;
  y_23._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar7,(uint128_t)x_32,(uint128_t)y_23);
  x_33._4_4_ = uVar26;
  x_33._0_4_ = in_stack_ffffffffffffe668;
  x_33._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_33);
  uVar17 = uVar14 & uVar27;
  x_34._4_4_ = uVar26;
  x_34._0_4_ = in_stack_ffffffffffffe668;
  x_34._8_8_ = uVar27;
  y_24._8_8_ = z4;
  y_24._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar8,(uint128_t)x_34,(uint128_t)y_24);
  x_35._4_4_ = uVar26;
  x_35._0_4_ = in_stack_ffffffffffffe668;
  x_35._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar5,(uint128_t)x_35,y_57);
  x_36._4_4_ = uVar26;
  x_36._0_4_ = in_stack_ffffffffffffe668;
  x_36._8_8_ = uVar27;
  y_25._8_8_ = z4;
  y_25._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar8,(uint128_t)x_36,(uint128_t)y_25);
  x_37._4_4_ = uVar26;
  x_37._0_4_ = in_stack_ffffffffffffe668;
  x_37._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_37);
  uVar18 = uVar14 & uVar27;
  x_38._4_4_ = uVar26;
  x_38._0_4_ = in_stack_ffffffffffffe668;
  x_38._8_8_ = uVar27;
  y_26._8_8_ = z4;
  y_26._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar9,(uint128_t)x_38,(uint128_t)y_26);
  x_39._4_4_ = uVar26;
  x_39._0_4_ = in_stack_ffffffffffffe668;
  x_39._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar5,(uint128_t)x_39,y_58);
  x_40._4_4_ = uVar26;
  x_40._0_4_ = in_stack_ffffffffffffe668;
  x_40._8_8_ = uVar27;
  y_27._8_8_ = z4;
  y_27._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar9,(uint128_t)x_40,(uint128_t)y_27);
  x_41._4_4_ = uVar26;
  x_41._0_4_ = in_stack_ffffffffffffe668;
  x_41._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_41);
  uVar19 = uVar14 & uVar27;
  x_42._4_4_ = uVar26;
  x_42._0_4_ = in_stack_ffffffffffffe668;
  x_42._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_42);
  pFVar5 = (FStar_UInt128_uint128 *)(uVar15 >> 0x28 | (uVar16 & 0xffffffffff) << 0x10);
  pFVar6 = (FStar_UInt128_uint128 *)(uVar16 >> 0x28 | (uVar17 & 0xffffffffff) << 0x10);
  pFVar7 = (FStar_UInt128_uint128 *)(uVar17 >> 0x28 | (uVar18 & 0xffffffffff) << 0x10);
  pFVar8 = (FStar_UInt128_uint128 *)(uVar18 >> 0x28 | (uVar19 & 0xffffffffff) << 0x10);
  uVar15 = (uVar14 & 0xffffffffff) << 0x10;
  uVar20 = uVar20 & 0xffffffffff;
  pFVar9 = FStar_UInt128_mul_wide(pFVar5,0x12631a5cf5d3ed,uVar15);
  pFVar10 = FStar_UInt128_mul_wide(pFVar5,0xf9dea2f79cd658,y_86);
  pFVar11 = FStar_UInt128_mul_wide(pFVar5,0x14de,y_87);
  pFVar12 = FStar_UInt128_mul_wide(pFVar5,0,y_88);
  pFVar5 = FStar_UInt128_mul_wide(pFVar5,0x10000000,y_89);
  FStar_UInt128_mul_wide(pFVar6,0x12631a5cf5d3ed,y_90);
  FStar_UInt128_mul_wide(pFVar6,0xf9dea2f79cd658,y_91);
  FStar_UInt128_mul_wide(pFVar6,0x14de,y_92);
  FStar_UInt128_mul_wide(pFVar6,0,y_93);
  FStar_UInt128_mul_wide(pFVar7,0x12631a5cf5d3ed,y_94);
  FStar_UInt128_mul_wide(pFVar7,0xf9dea2f79cd658,y_95);
  FStar_UInt128_mul_wide(pFVar7,0x14de,y_96);
  FStar_UInt128_mul_wide(pFVar8,0x12631a5cf5d3ed,y_97);
  FStar_UInt128_mul_wide(pFVar8,0xf9dea2f79cd658,y_98);
  FStar_UInt128_mul_wide((FStar_UInt128_uint128 *)(uVar19 >> 0x28 | uVar15),0x12631a5cf5d3ed,y_99);
  x_43._4_4_ = uVar26;
  x_43._0_4_ = in_stack_ffffffffffffe668;
  x_43._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar9,(uint128_t)x_43,(uint32_t)y_86);
  x_44._4_4_ = uVar26;
  x_44._0_4_ = in_stack_ffffffffffffe668;
  x_44._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_44);
  uVar18 = uVar14 & uVar27;
  x_45._4_4_ = uVar26;
  x_45._0_4_ = in_stack_ffffffffffffe668;
  x_45._8_8_ = uVar27;
  y_28._8_8_ = z4;
  y_28._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar10,(uint128_t)x_45,(uint128_t)y_28);
  x_46._4_4_ = uVar26;
  x_46._0_4_ = in_stack_ffffffffffffe668;
  x_46._8_8_ = uVar27;
  y_29._8_8_ = z4;
  y_29._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_46,(uint128_t)y_29);
  x_47._4_4_ = uVar26;
  x_47._0_4_ = in_stack_ffffffffffffe668;
  x_47._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar6,(uint128_t)x_47,y_59);
  x_48._4_4_ = uVar26;
  x_48._0_4_ = in_stack_ffffffffffffe668;
  x_48._8_8_ = uVar27;
  y_30._8_8_ = z4;
  y_30._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar10,(uint128_t)x_48,(uint128_t)y_30);
  x_49._4_4_ = uVar26;
  x_49._0_4_ = in_stack_ffffffffffffe668;
  x_49._8_8_ = uVar27;
  y_31._8_8_ = z4;
  y_31._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar6,(uint128_t)x_49,(uint128_t)y_31);
  x_50._4_4_ = uVar26;
  x_50._0_4_ = in_stack_ffffffffffffe668;
  x_50._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_50);
  uVar15 = uVar14 & uVar27;
  x_51._4_4_ = uVar26;
  x_51._0_4_ = in_stack_ffffffffffffe668;
  x_51._8_8_ = uVar27;
  y_32._8_8_ = z4;
  y_32._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar11,(uint128_t)x_51,(uint128_t)y_32);
  x_52._4_4_ = uVar26;
  x_52._0_4_ = in_stack_ffffffffffffe668;
  x_52._8_8_ = uVar27;
  y_33._8_8_ = z4;
  y_33._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_52,(uint128_t)y_33);
  x_53._4_4_ = uVar26;
  x_53._0_4_ = in_stack_ffffffffffffe668;
  x_53._8_8_ = uVar27;
  y_34._8_8_ = z4;
  y_34._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_53,(uint128_t)y_34);
  x_54._4_4_ = uVar26;
  x_54._0_4_ = in_stack_ffffffffffffe668;
  x_54._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar6,(uint128_t)x_54,y_60);
  x_55._4_4_ = uVar26;
  x_55._0_4_ = in_stack_ffffffffffffe668;
  x_55._8_8_ = uVar27;
  y_35._8_8_ = z4;
  y_35._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar11,(uint128_t)x_55,(uint128_t)y_35);
  x_56._4_4_ = uVar26;
  x_56._0_4_ = in_stack_ffffffffffffe668;
  x_56._8_8_ = uVar27;
  y_36._8_8_ = z4;
  y_36._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_56,(uint128_t)y_36);
  x_57._4_4_ = uVar26;
  x_57._0_4_ = in_stack_ffffffffffffe668;
  x_57._8_8_ = uVar27;
  y_37._8_8_ = z4;
  y_37._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar6,(uint128_t)x_57,(uint128_t)y_37);
  x_58._4_4_ = uVar26;
  x_58._0_4_ = in_stack_ffffffffffffe668;
  x_58._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_58);
  uVar16 = uVar14 & uVar27;
  x_59._4_4_ = uVar26;
  x_59._0_4_ = in_stack_ffffffffffffe668;
  x_59._8_8_ = uVar27;
  y_38._8_8_ = z4;
  y_38._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar12,(uint128_t)x_59,(uint128_t)y_38);
  x_60._4_4_ = uVar26;
  x_60._0_4_ = in_stack_ffffffffffffe668;
  x_60._8_8_ = uVar27;
  y_39._8_8_ = z4;
  y_39._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_60,(uint128_t)y_39);
  x_61._4_4_ = uVar26;
  x_61._0_4_ = in_stack_ffffffffffffe668;
  x_61._8_8_ = uVar27;
  y_40._8_8_ = z4;
  y_40._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_61,(uint128_t)y_40);
  x_62._4_4_ = uVar26;
  x_62._0_4_ = in_stack_ffffffffffffe668;
  x_62._8_8_ = uVar27;
  y_41._8_8_ = z4;
  y_41._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_62,(uint128_t)y_41);
  x_63._4_4_ = uVar26;
  x_63._0_4_ = in_stack_ffffffffffffe668;
  x_63._8_8_ = uVar27;
  FStar_UInt128_shift_right(pFVar6,(uint128_t)x_63,y_61);
  x_64._4_4_ = uVar26;
  x_64._0_4_ = in_stack_ffffffffffffe668;
  x_64._8_8_ = uVar27;
  y_42._8_8_ = z4;
  y_42._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar12,(uint128_t)x_64,(uint128_t)y_42);
  x_65._4_4_ = uVar26;
  x_65._0_4_ = in_stack_ffffffffffffe668;
  x_65._8_8_ = uVar27;
  y_43._8_8_ = z4;
  y_43._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_65,(uint128_t)y_43);
  x_66._4_4_ = uVar26;
  x_66._0_4_ = in_stack_ffffffffffffe668;
  x_66._8_8_ = uVar27;
  y_44._8_8_ = z4;
  y_44._0_8_ = local_1988;
  pFVar6 = FStar_UInt128_add_mod(pFVar6,(uint128_t)x_66,(uint128_t)y_44);
  x_67._4_4_ = uVar26;
  x_67._0_4_ = in_stack_ffffffffffffe668;
  x_67._8_8_ = uVar27;
  y_45._8_8_ = z4;
  y_45._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar6,(uint128_t)x_67,(uint128_t)y_45);
  x_68._4_4_ = uVar26;
  x_68._0_4_ = in_stack_ffffffffffffe668;
  x_68._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_68);
  uVar17 = uVar14 & uVar27;
  x_69._4_4_ = uVar26;
  x_69._0_4_ = in_stack_ffffffffffffe668;
  x_69._8_8_ = uVar27;
  y_46._8_8_ = z4;
  y_46._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_69,(uint128_t)y_46);
  x_70._4_4_ = uVar26;
  x_70._0_4_ = in_stack_ffffffffffffe668;
  x_70._8_8_ = uVar27;
  y_47._8_8_ = z4;
  y_47._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_70,(uint128_t)y_47);
  x_71._4_4_ = uVar26;
  x_71._0_4_ = in_stack_ffffffffffffe668;
  x_71._8_8_ = uVar27;
  y_48._8_8_ = z4;
  y_48._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_71,(uint128_t)y_48);
  x_72._4_4_ = uVar26;
  x_72._0_4_ = in_stack_ffffffffffffe668;
  x_72._8_8_ = uVar27;
  y_49._8_8_ = z4;
  y_49._0_8_ = local_1988;
  pFVar5 = FStar_UInt128_add_mod(pFVar5,(uint128_t)x_72,(uint128_t)y_49);
  x_73._4_4_ = uVar26;
  x_73._0_4_ = in_stack_ffffffffffffe668;
  x_73._8_8_ = uVar27;
  y_50._8_8_ = z4;
  y_50._0_8_ = local_1988;
  FStar_UInt128_add_mod(pFVar5,(uint128_t)x_73,(uint128_t)y_50);
  x_74._4_4_ = uVar26;
  x_74._0_4_ = in_stack_ffffffffffffe668;
  x_74._8_8_ = uVar27;
  uVar14 = FStar_UInt128_uint128_to_uint64((uint128_t)x_74);
  lVar21 = -((long)(uVar1 - uVar18) >> 0x3f);
  uVar18 = ((lVar21 << 0x38) + uVar1) - uVar18;
  lVar22 = -((long)(uVar2 - (uVar15 + lVar21)) >> 0x3f);
  uVar15 = ((lVar22 << 0x38) + uVar2) - (uVar15 + lVar21);
  lVar21 = -((long)(uVar3 - (uVar16 + lVar22)) >> 0x3f);
  uVar16 = ((lVar21 << 0x38) + uVar3) - (uVar16 + lVar22);
  lVar22 = -((long)(uVar4 - (uVar17 + lVar21)) >> 0x3f);
  uVar17 = ((lVar22 << 0x38) + uVar4) - (uVar17 + lVar21);
  uVar20 = (((uVar20 - ((uVar14 & 0xffffffffff) + lVar22) >> 0x3f) << 0x28) + uVar20) -
           ((uVar14 & 0xffffffffff) + lVar22);
  lVar22 = -((long)(uVar18 + 0xffed9ce5a30a2c13) >> 0x3f);
  lVar23 = -((long)(uVar15 - (lVar22 + 0xf9dea2f79cd658)) >> 0x3f);
  lVar21 = (long)(uVar16 - (lVar23 + 0x14de)) >> 0x3f;
  lVar24 = -((long)(uVar17 + lVar21) >> 0x3f);
  lVar25 = -((long)(uVar20 - (lVar24 + 0x10000000)) >> 0x3f);
  uVar19 = lVar25 - 1;
  *z = uVar18 ^ uVar19 & (uVar18 ^ (lVar22 << 0x38) + uVar18 + 0xffed9ce5a30a2c13);
  z[1] = uVar15 ^ uVar19 & (uVar15 ^ ((lVar23 << 0x38) + uVar15) - (lVar22 + 0xf9dea2f79cd658));
  z[2] = uVar16 ^ uVar19 & (uVar16 ^ ((-lVar21 << 0x38) + uVar16) - (lVar23 + 0x14de));
  z[3] = uVar17 ^ uVar19 & (uVar17 ^ (lVar24 << 0x38) + uVar17 + lVar21);
  z[4] = uVar20 ^ uVar19 & (uVar20 ^ ((lVar25 << 0x38) + uVar20) - (lVar24 + 0x10000000));
  return;
}

Assistant:

static inline void barrett_reduction(uint64_t *z, uint64_t *t)
{
  uint64_t t0 = t[0U];
  uint64_t t1 = t[1U];
  uint64_t t2 = t[2U];
  uint64_t t3 = t[3U];
  uint64_t t4 = t[4U];
  uint64_t t5 = t[5U];
  uint64_t t6 = t[6U];
  uint64_t t7 = t[7U];
  uint64_t t8 = t[8U];
  uint64_t t9 = t[9U];
  uint64_t m00 = 0x12631a5cf5d3edULL;
  uint64_t m10 = 0xf9dea2f79cd658ULL;
  uint64_t m20 = 0x000000000014deULL;
  uint64_t m30 = 0x00000000000000ULL;
  uint64_t m40 = 0x00000010000000ULL;
  uint64_t m0 = m00;
  uint64_t m1 = m10;
  uint64_t m2 = m20;
  uint64_t m3 = m30;
  uint64_t m4 = m40;
  uint64_t m010 = 0x9ce5a30a2c131bULL;
  uint64_t m110 = 0x215d086329a7edULL;
  uint64_t m210 = 0xffffffffeb2106ULL;
  uint64_t m310 = 0xffffffffffffffULL;
  uint64_t m410 = 0x00000fffffffffULL;
  uint64_t mu0 = m010;
  uint64_t mu1 = m110;
  uint64_t mu2 = m210;
  uint64_t mu3 = m310;
  uint64_t mu4 = m410;
  uint64_t y_ = (t5 & 0xffffffULL) << 32U;
  uint64_t x_ = t4 >> 24U;
  uint64_t z00 = x_ | y_;
  uint64_t y_0 = (t6 & 0xffffffULL) << 32U;
  uint64_t x_0 = t5 >> 24U;
  uint64_t z10 = x_0 | y_0;
  uint64_t y_1 = (t7 & 0xffffffULL) << 32U;
  uint64_t x_1 = t6 >> 24U;
  uint64_t z20 = x_1 | y_1;
  uint64_t y_2 = (t8 & 0xffffffULL) << 32U;
  uint64_t x_2 = t7 >> 24U;
  uint64_t z30 = x_2 | y_2;
  uint64_t y_3 = (t9 & 0xffffffULL) << 32U;
  uint64_t x_3 = t8 >> 24U;
  uint64_t z40 = x_3 | y_3;
  uint64_t q0 = z00;
  uint64_t q1 = z10;
  uint64_t q2 = z20;
  uint64_t q3 = z30;
  uint64_t q4 = z40;
  FStar_UInt128_uint128 xy000 = FStar_UInt128_mul_wide(q0, mu0);
  FStar_UInt128_uint128 xy010 = FStar_UInt128_mul_wide(q0, mu1);
  FStar_UInt128_uint128 xy020 = FStar_UInt128_mul_wide(q0, mu2);
  FStar_UInt128_uint128 xy030 = FStar_UInt128_mul_wide(q0, mu3);
  FStar_UInt128_uint128 xy040 = FStar_UInt128_mul_wide(q0, mu4);
  FStar_UInt128_uint128 xy100 = FStar_UInt128_mul_wide(q1, mu0);
  FStar_UInt128_uint128 xy110 = FStar_UInt128_mul_wide(q1, mu1);
  FStar_UInt128_uint128 xy120 = FStar_UInt128_mul_wide(q1, mu2);
  FStar_UInt128_uint128 xy130 = FStar_UInt128_mul_wide(q1, mu3);
  FStar_UInt128_uint128 xy14 = FStar_UInt128_mul_wide(q1, mu4);
  FStar_UInt128_uint128 xy200 = FStar_UInt128_mul_wide(q2, mu0);
  FStar_UInt128_uint128 xy210 = FStar_UInt128_mul_wide(q2, mu1);
  FStar_UInt128_uint128 xy220 = FStar_UInt128_mul_wide(q2, mu2);
  FStar_UInt128_uint128 xy23 = FStar_UInt128_mul_wide(q2, mu3);
  FStar_UInt128_uint128 xy24 = FStar_UInt128_mul_wide(q2, mu4);
  FStar_UInt128_uint128 xy300 = FStar_UInt128_mul_wide(q3, mu0);
  FStar_UInt128_uint128 xy310 = FStar_UInt128_mul_wide(q3, mu1);
  FStar_UInt128_uint128 xy32 = FStar_UInt128_mul_wide(q3, mu2);
  FStar_UInt128_uint128 xy33 = FStar_UInt128_mul_wide(q3, mu3);
  FStar_UInt128_uint128 xy34 = FStar_UInt128_mul_wide(q3, mu4);
  FStar_UInt128_uint128 xy400 = FStar_UInt128_mul_wide(q4, mu0);
  FStar_UInt128_uint128 xy41 = FStar_UInt128_mul_wide(q4, mu1);
  FStar_UInt128_uint128 xy42 = FStar_UInt128_mul_wide(q4, mu2);
  FStar_UInt128_uint128 xy43 = FStar_UInt128_mul_wide(q4, mu3);
  FStar_UInt128_uint128 xy44 = FStar_UInt128_mul_wide(q4, mu4);
  FStar_UInt128_uint128 z01 = xy000;
  FStar_UInt128_uint128 z11 = FStar_UInt128_add_mod(xy010, xy100);
  FStar_UInt128_uint128 z21 = FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy020, xy110), xy200);
  FStar_UInt128_uint128
  z31 =
    FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy030, xy120), xy210),
      xy300);
  FStar_UInt128_uint128
  z41 =
    FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy040,
            xy130),
          xy220),
        xy310),
      xy400);
  FStar_UInt128_uint128
  z5 =
    FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy14, xy23), xy32),
      xy41);
  FStar_UInt128_uint128 z6 = FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy24, xy33), xy42);
  FStar_UInt128_uint128 z7 = FStar_UInt128_add_mod(xy34, xy43);
  FStar_UInt128_uint128 z8 = xy44;
  FStar_UInt128_uint128 carry0 = FStar_UInt128_shift_right(z01, 56U);
  FStar_UInt128_uint128 c00 = carry0;
  FStar_UInt128_uint128 carry1 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z11, c00), 56U);
  FStar_UInt128_uint128 c10 = carry1;
  FStar_UInt128_uint128 carry2 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z21, c10), 56U);
  FStar_UInt128_uint128 c20 = carry2;
  FStar_UInt128_uint128 carry3 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z31, c20), 56U);
  FStar_UInt128_uint128 c30 = carry3;
  FStar_UInt128_uint128 carry4 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z41, c30), 56U);
  uint64_t
  t100 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z41, c30)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c40 = carry4;
  uint64_t t410 = t100;
  FStar_UInt128_uint128 carry5 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z5, c40), 56U);
  uint64_t
  t101 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z5, c40)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c5 = carry5;
  uint64_t t51 = t101;
  FStar_UInt128_uint128 carry6 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z6, c5), 56U);
  uint64_t
  t102 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z6, c5)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c6 = carry6;
  uint64_t t61 = t102;
  FStar_UInt128_uint128 carry7 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z7, c6), 56U);
  uint64_t
  t103 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z7, c6)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c7 = carry7;
  uint64_t t71 = t103;
  FStar_UInt128_uint128 carry8 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z8, c7), 56U);
  uint64_t
  t104 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z8, c7)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c8 = carry8;
  uint64_t t81 = t104;
  uint64_t t91 = FStar_UInt128_uint128_to_uint64(c8);
  uint64_t qmu4_ = t410;
  uint64_t qmu5_ = t51;
  uint64_t qmu6_ = t61;
  uint64_t qmu7_ = t71;
  uint64_t qmu8_ = t81;
  uint64_t qmu9_ = t91;
  uint64_t y_4 = (qmu5_ & 0xffffffffffULL) << 16U;
  uint64_t x_4 = qmu4_ >> 40U;
  uint64_t z02 = x_4 | y_4;
  uint64_t y_5 = (qmu6_ & 0xffffffffffULL) << 16U;
  uint64_t x_5 = qmu5_ >> 40U;
  uint64_t z12 = x_5 | y_5;
  uint64_t y_6 = (qmu7_ & 0xffffffffffULL) << 16U;
  uint64_t x_6 = qmu6_ >> 40U;
  uint64_t z22 = x_6 | y_6;
  uint64_t y_7 = (qmu8_ & 0xffffffffffULL) << 16U;
  uint64_t x_7 = qmu7_ >> 40U;
  uint64_t z32 = x_7 | y_7;
  uint64_t y_8 = (qmu9_ & 0xffffffffffULL) << 16U;
  uint64_t x_8 = qmu8_ >> 40U;
  uint64_t z42 = x_8 | y_8;
  uint64_t qdiv0 = z02;
  uint64_t qdiv1 = z12;
  uint64_t qdiv2 = z22;
  uint64_t qdiv3 = z32;
  uint64_t qdiv4 = z42;
  uint64_t r0 = t0;
  uint64_t r1 = t1;
  uint64_t r2 = t2;
  uint64_t r3 = t3;
  uint64_t r4 = t4 & 0xffffffffffULL;
  FStar_UInt128_uint128 xy00 = FStar_UInt128_mul_wide(qdiv0, m0);
  FStar_UInt128_uint128 xy01 = FStar_UInt128_mul_wide(qdiv0, m1);
  FStar_UInt128_uint128 xy02 = FStar_UInt128_mul_wide(qdiv0, m2);
  FStar_UInt128_uint128 xy03 = FStar_UInt128_mul_wide(qdiv0, m3);
  FStar_UInt128_uint128 xy04 = FStar_UInt128_mul_wide(qdiv0, m4);
  FStar_UInt128_uint128 xy10 = FStar_UInt128_mul_wide(qdiv1, m0);
  FStar_UInt128_uint128 xy11 = FStar_UInt128_mul_wide(qdiv1, m1);
  FStar_UInt128_uint128 xy12 = FStar_UInt128_mul_wide(qdiv1, m2);
  FStar_UInt128_uint128 xy13 = FStar_UInt128_mul_wide(qdiv1, m3);
  FStar_UInt128_uint128 xy20 = FStar_UInt128_mul_wide(qdiv2, m0);
  FStar_UInt128_uint128 xy21 = FStar_UInt128_mul_wide(qdiv2, m1);
  FStar_UInt128_uint128 xy22 = FStar_UInt128_mul_wide(qdiv2, m2);
  FStar_UInt128_uint128 xy30 = FStar_UInt128_mul_wide(qdiv3, m0);
  FStar_UInt128_uint128 xy31 = FStar_UInt128_mul_wide(qdiv3, m1);
  FStar_UInt128_uint128 xy40 = FStar_UInt128_mul_wide(qdiv4, m0);
  FStar_UInt128_uint128 carry9 = FStar_UInt128_shift_right(xy00, 56U);
  uint64_t t105 = FStar_UInt128_uint128_to_uint64(xy00) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c0 = carry9;
  uint64_t t010 = t105;
  FStar_UInt128_uint128
  carry10 =
    FStar_UInt128_shift_right(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy01, xy10), c0),
      56U);
  uint64_t
  t106 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy01, xy10), c0))
    & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c11 = carry10;
  uint64_t t110 = t106;
  FStar_UInt128_uint128
  carry11 =
    FStar_UInt128_shift_right(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy02,
            xy11),
          xy20),
        c11),
      56U);
  uint64_t
  t107 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy02,
            xy11),
          xy20),
        c11))
    & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c21 = carry11;
  uint64_t t210 = t107;
  FStar_UInt128_uint128
  carry =
    FStar_UInt128_shift_right(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy03,
              xy12),
            xy21),
          xy30),
        c21),
      56U);
  uint64_t
  t108 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy03,
              xy12),
            xy21),
          xy30),
        c21))
    & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c31 = carry;
  uint64_t t310 = t108;
  uint64_t
  t411 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy04,
                xy13),
              xy22),
            xy31),
          xy40),
        c31))
    & 0xffffffffffULL;
  uint64_t qmul0 = t010;
  uint64_t qmul1 = t110;
  uint64_t qmul2 = t210;
  uint64_t qmul3 = t310;
  uint64_t qmul4 = t411;
  uint64_t b5 = (r0 - qmul0) >> 63U;
  uint64_t t109 = (b5 << 56U) + r0 - qmul0;
  uint64_t c1 = b5;
  uint64_t t011 = t109;
  uint64_t b6 = (r1 - (qmul1 + c1)) >> 63U;
  uint64_t t1010 = (b6 << 56U) + r1 - (qmul1 + c1);
  uint64_t c2 = b6;
  uint64_t t111 = t1010;
  uint64_t b7 = (r2 - (qmul2 + c2)) >> 63U;
  uint64_t t1011 = (b7 << 56U) + r2 - (qmul2 + c2);
  uint64_t c3 = b7;
  uint64_t t211 = t1011;
  uint64_t b8 = (r3 - (qmul3 + c3)) >> 63U;
  uint64_t t1012 = (b8 << 56U) + r3 - (qmul3 + c3);
  uint64_t c4 = b8;
  uint64_t t311 = t1012;
  uint64_t b9 = (r4 - (qmul4 + c4)) >> 63U;
  uint64_t t1013 = (b9 << 40U) + r4 - (qmul4 + c4);
  uint64_t t412 = t1013;
  uint64_t s0 = t011;
  uint64_t s1 = t111;
  uint64_t s2 = t211;
  uint64_t s3 = t311;
  uint64_t s4 = t412;
  uint64_t m01 = 0x12631a5cf5d3edULL;
  uint64_t m11 = 0xf9dea2f79cd658ULL;
  uint64_t m21 = 0x000000000014deULL;
  uint64_t m31 = 0x00000000000000ULL;
  uint64_t m41 = 0x00000010000000ULL;
  uint64_t y0 = m01;
  uint64_t y1 = m11;
  uint64_t y2 = m21;
  uint64_t y3 = m31;
  uint64_t y4 = m41;
  uint64_t b10 = (s0 - y0) >> 63U;
  uint64_t t1014 = (b10 << 56U) + s0 - y0;
  uint64_t b0 = b10;
  uint64_t t01 = t1014;
  uint64_t b11 = (s1 - (y1 + b0)) >> 63U;
  uint64_t t1015 = (b11 << 56U) + s1 - (y1 + b0);
  uint64_t b1 = b11;
  uint64_t t11 = t1015;
  uint64_t b12 = (s2 - (y2 + b1)) >> 63U;
  uint64_t t1016 = (b12 << 56U) + s2 - (y2 + b1);
  uint64_t b2 = b12;
  uint64_t t21 = t1016;
  uint64_t b13 = (s3 - (y3 + b2)) >> 63U;
  uint64_t t1017 = (b13 << 56U) + s3 - (y3 + b2);
  uint64_t b3 = b13;
  uint64_t t31 = t1017;
  uint64_t b = (s4 - (y4 + b3)) >> 63U;
  uint64_t t10 = (b << 56U) + s4 - (y4 + b3);
  uint64_t b4 = b;
  uint64_t t41 = t10;
  uint64_t mask = b4 - 1ULL;
  uint64_t z03 = s0 ^ (mask & (s0 ^ t01));
  uint64_t z13 = s1 ^ (mask & (s1 ^ t11));
  uint64_t z23 = s2 ^ (mask & (s2 ^ t21));
  uint64_t z33 = s3 ^ (mask & (s3 ^ t31));
  uint64_t z43 = s4 ^ (mask & (s4 ^ t41));
  uint64_t z04 = z03;
  uint64_t z14 = z13;
  uint64_t z24 = z23;
  uint64_t z34 = z33;
  uint64_t z44 = z43;
  uint64_t o0 = z04;
  uint64_t o1 = z14;
  uint64_t o2 = z24;
  uint64_t o3 = z34;
  uint64_t o4 = z44;
  uint64_t z0 = o0;
  uint64_t z1 = o1;
  uint64_t z2 = o2;
  uint64_t z3 = o3;
  uint64_t z4 = o4;
  z[0U] = z0;
  z[1U] = z1;
  z[2U] = z2;
  z[3U] = z3;
  z[4U] = z4;
}